

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSeq.c
# Opt level: O3

int Cec_ManSeqResimulateCounter(Gia_Man_t *pAig,Cec_ParSim_t *pPars,Abc_Cex_t *pCex)

{
  undefined1 auVar1 [16];
  Cec_ParSim_t *pCVar2;
  int iVar3;
  int iVar4;
  Vec_Ptr_t *vInfo;
  long lVar5;
  void **ppvVar6;
  long lVar7;
  uint uVar8;
  void **ppvVar9;
  char *format;
  ulong uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  timespec ts;
  timespec local_50;
  Cec_ParSim_t *local_40;
  void **local_38;
  
  iVar3 = clock_gettime(3,&local_50);
  if (iVar3 < 0) {
    lVar7 = 1;
  }
  else {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_50.tv_nsec),8);
    lVar7 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_50.tv_sec * -1000000;
  }
  if (pCex == (Abc_Cex_t *)0x0) {
    format = "Cec_ManSeqResimulateCounter(): Counter-example is not available.\n";
  }
  else if (pAig->pReprs == (Gia_Rpr_t *)0x0) {
    format = "Cec_ManSeqResimulateCounter(): Equivalence classes are not available.\n";
  }
  else if (pAig->nRegs == 0) {
    format = "Cec_ManSeqResimulateCounter(): Not a sequential AIG.\n";
  }
  else {
    if (pAig->vCis->nSize - pAig->nRegs == pCex->nPis) {
      if (pPars->fVerbose != 0) {
        Abc_Print(1,"Resimulating %d timeframes.\n",(ulong)(pPars->nFrames + pCex->iFrame + 1));
      }
      Gia_ManRandom(1);
      uVar8 = (pPars->nFrames + pCex->iFrame + 1) * (pAig->vCis->nSize - pAig->nRegs) + pAig->nRegs;
      local_40 = pPars;
      local_38 = (void **)malloc((long)(int)uVar8 * 0xc);
      auVar1 = _DAT_0094e250;
      if (0 < (int)uVar8) {
        ppvVar9 = local_38 + (int)uVar8;
        uVar10 = (ulong)(uVar8 + 1 & 0xfffffffe);
        lVar5 = (ulong)uVar8 - 1;
        auVar11._8_4_ = (int)lVar5;
        auVar11._0_8_ = lVar5;
        auVar11._12_4_ = (int)((ulong)lVar5 >> 0x20);
        ppvVar6 = local_38 + 1;
        auVar11 = auVar11 ^ _DAT_0094e250;
        auVar12 = _DAT_0094e240;
        do {
          auVar13 = auVar12 ^ auVar1;
          if ((bool)(~(auVar13._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar13._0_4_ ||
                      auVar11._4_4_ < auVar13._4_4_) & 1)) {
            ppvVar6[-1] = ppvVar9;
          }
          if ((auVar13._12_4_ != auVar11._12_4_ || auVar13._8_4_ <= auVar11._8_4_) &&
              auVar13._12_4_ <= auVar11._12_4_) {
            *ppvVar6 = (void *)((long)ppvVar9 + 4);
          }
          lVar5 = auVar12._8_8_;
          auVar12._0_8_ = auVar12._0_8_ + 2;
          auVar12._8_8_ = lVar5 + 2;
          ppvVar6 = ppvVar6 + 2;
          ppvVar9 = ppvVar9 + 1;
          uVar10 = uVar10 - 2;
        } while (uVar10 != 0);
      }
      vInfo = (Vec_Ptr_t *)malloc(0x10);
      vInfo->nSize = uVar8;
      vInfo->nCap = uVar8;
      vInfo->pArray = local_38;
      Cec_ManSeqDeriveInfoFromCex(vInfo,pAig,pCex);
      pCVar2 = local_40;
      if (local_40->fVerbose != 0) {
        Gia_ManEquivPrintClasses(pAig,0,0.0);
      }
      iVar3 = Cec_ManSeqResimulateInfo(pAig,vInfo,(Abc_Cex_t *)0x0,pCVar2->fCheckMiter);
      if (pCVar2->fVerbose != 0) {
        Gia_ManEquivPrintClasses(pAig,0,0.0);
      }
      if (local_38 != (void **)0x0) {
        free(local_38);
      }
      free(vInfo);
      if (pCVar2->fVerbose == 0) {
        return iVar3;
      }
      Abc_Print(1,"%s =","Time");
      iVar4 = clock_gettime(3,&local_50);
      if (iVar4 < 0) {
        lVar5 = -1;
      }
      else {
        lVar5 = local_50.tv_nsec / 1000 + local_50.tv_sec * 1000000;
      }
      Abc_Print(1,"%9.2f sec\n",(double)(lVar5 + lVar7) / 1000000.0);
      return iVar3;
    }
    format = 
    "Cec_ManSeqResimulateCounter(): The number of PIs in the AIG and the counter-example differ.\n";
  }
  Abc_Print(1,format);
  return -1;
}

Assistant:

int Cec_ManSeqResimulateCounter( Gia_Man_t * pAig, Cec_ParSim_t * pPars, Abc_Cex_t * pCex )
{
    Vec_Ptr_t * vSimInfo;
    int RetValue;
    abctime clkTotal = Abc_Clock();
    if ( pCex == NULL )
    {
        Abc_Print( 1, "Cec_ManSeqResimulateCounter(): Counter-example is not available.\n" );
        return -1;
    }
    if ( pAig->pReprs == NULL )
    {
        Abc_Print( 1, "Cec_ManSeqResimulateCounter(): Equivalence classes are not available.\n" );
        return -1;
    }
    if ( Gia_ManRegNum(pAig) == 0 )
    {
        Abc_Print( 1, "Cec_ManSeqResimulateCounter(): Not a sequential AIG.\n" );
        return -1;
    }
//    if ( Gia_ManRegNum(pAig) != pCex->nRegs || Gia_ManPiNum(pAig) != pCex->nPis )
    if ( Gia_ManPiNum(pAig) != pCex->nPis )
    {
        Abc_Print( 1, "Cec_ManSeqResimulateCounter(): The number of PIs in the AIG and the counter-example differ.\n" );
        return -1;
    }
    if ( pPars->fVerbose )
        Abc_Print( 1, "Resimulating %d timeframes.\n", pPars->nFrames + pCex->iFrame + 1 );
    Gia_ManRandom( 1 );
    vSimInfo = Vec_PtrAllocSimInfo( Gia_ManRegNum(pAig) + 
        Gia_ManPiNum(pAig) * (pPars->nFrames + pCex->iFrame + 1), 1 );
    Cec_ManSeqDeriveInfoFromCex( vSimInfo, pAig, pCex );
    if ( pPars->fVerbose )
        Gia_ManEquivPrintClasses( pAig, 0, 0 );
    RetValue = Cec_ManSeqResimulateInfo( pAig, vSimInfo, NULL, pPars->fCheckMiter );
    if ( pPars->fVerbose )
        Gia_ManEquivPrintClasses( pAig, 0, 0 );
    Vec_PtrFree( vSimInfo );
    if ( pPars->fVerbose )
        ABC_PRT( "Time", Abc_Clock() - clkTotal );
//    if ( RetValue && pPars->fCheckMiter )
//        Abc_Print( 1, "Cec_ManSeqResimulateCounter(): An output of the miter is asserted!\n" );
    return RetValue;
}